

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O2

float __thiscall
ezc3d::c3d::readFloat
          (c3d *this,PROCESSOR_TYPE processorType,fstream *file,int nByteFromPrevious,seekdir *pos)

{
  char cVar1;
  runtime_error *this_00;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  vector<char,_std::allocator<char>_> *c;
  
  c = &this->c_float;
  readFile(this,file,this->m_nByteToRead_float,c,nByteFromPrevious,pos);
  if (processorType != INTEL) {
    if (processorType == DEC) {
      *(this->c_float_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start =
           (this->c_float).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      (this->c_float_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[1] =
           (this->c_float).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[3];
      (this->c_float_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[2] =
           *(this->c_float).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
      cVar1 = (this->c_float).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[1];
      cVar2 = cVar1 + -1;
      if (cVar1 == '\0') {
        cVar2 = '\0';
      }
      (this->c_float_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[3] = cVar2;
      uVar5 = 4;
    }
    else {
      if (processorType != MIPS) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Wrong type of processor for floating points");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar3 = -1;
      uVar4 = 0;
      while( true ) {
        uVar5 = (ulong)this->m_nByteToRead_float;
        if (uVar5 <= uVar4) break;
        (this->c_float_tp).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] =
             (c->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start[this->m_nByteToRead_float + iVar3];
        uVar4 = uVar4 + 1;
        iVar3 = iVar3 + -1;
      }
    }
    c = &this->c_float_tp;
    (c->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
    [uVar5] = '\0';
  }
  return *(float *)(c->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
}

Assistant:

float ezc3d::c3d::readFloat(PROCESSOR_TYPE processorType, std::fstream &file,
                            int nByteFromPrevious,
                            const std::ios_base::seekdir &pos) {
  readFile(file, m_nByteToRead_float, c_float, nByteFromPrevious, pos);
  float out;
  if (processorType == PROCESSOR_TYPE::INTEL) {
    out = *reinterpret_cast<float *>(&c_float[0]);
  } else if (processorType == PROCESSOR_TYPE::DEC) {
    c_float_tp[0] = c_float[2];
    c_float_tp[1] = c_float[3];
    c_float_tp[2] = c_float[0];
    if (c_float[1] != 0)
      c_float_tp[3] = c_float[1] - 1;
    else
      c_float_tp[3] = c_float[1];
    c_float_tp[4] = '\0';
    out = *reinterpret_cast<float *>(&c_float_tp[0]);
  } else if (processorType == PROCESSOR_TYPE::MIPS) {
    for (unsigned int i = 0; i < m_nByteToRead_float; ++i)
      c_float_tp[i] = c_float[m_nByteToRead_float - 1 - i];
    c_float_tp[m_nByteToRead_float] = '\0';
    out = *reinterpret_cast<float *>(&c_float_tp[0]);
  } else {
    throw std::runtime_error("Wrong type of processor for floating points");
  }
  return out;
}